

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O3

char * Bbl_ManSortSop(char *pSop,int nVars)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  char **pCubes;
  ulong uVar3;
  char *pcVar4;
  int nCubes;
  ulong uVar5;
  int iVar6;
  size_t __n;
  
  sVar1 = strlen(pSop);
  iVar6 = nVars + 3;
  uVar3 = (ulong)(uint)((int)sVar1 >> 0x1f) << 0x20 | sVar1 & 0xffffffff;
  uVar5 = (long)uVar3 / (long)iVar6;
  if ((int)((long)uVar3 % (long)iVar6) != 0) {
    __assert_fail("Length % (nVars + 3) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/bbl/bblif.c"
                  ,0x365,"char *Bbl_ManSortSop(char *, int)");
  }
  nCubes = (int)uVar5;
  if (nCubes < 2) {
    sVar1 = (long)((sVar1 << 0x20) + 0x100000000) >> 0x20;
    __dest = malloc(sVar1);
    pcVar2 = (char *)memcpy(__dest,pSop,sVar1);
    return pcVar2;
  }
  uVar5 = uVar5 & 0xffffffff;
  pCubes = (char **)malloc(uVar5 * 8);
  __n = (size_t)iVar6;
  uVar3 = 0;
  do {
    pCubes[uVar3] = pSop;
    uVar3 = uVar3 + 1;
    pSop = pSop + __n;
  } while (uVar5 != uVar3);
  if (nCubes < 300) {
    Bbl_ManSortCubes(pCubes,nCubes,nVars);
  }
  pcVar4 = (char *)malloc((long)((sVar1 << 0x20) + 0x100000000) >> 0x20);
  uVar3 = 0;
  pcVar2 = pcVar4;
  do {
    memcpy(pcVar2,pCubes[uVar3],__n);
    uVar3 = uVar3 + 1;
    pcVar2 = pcVar2 + __n;
  } while (uVar5 != uVar3);
  free(pCubes);
  pcVar4[nCubes * iVar6] = '\0';
  return pcVar4;
}

Assistant:

char * Bbl_ManSortSop( char * pSop, int nVars )
{
    char ** pCubes, * pSopNew;
    int c, Length, nCubes;
    Length = strlen(pSop);
    assert( Length % (nVars + 3) == 0 );
    nCubes = Length / (nVars + 3);
    if ( nCubes < 2 )
    {
        pSopNew = BBLIF_ALLOC( char, Length + 1 );
        memcpy( pSopNew, pSop, Length + 1 );
        return pSopNew;
    }
    pCubes = BBLIF_ALLOC( char *, nCubes );
    for ( c = 0; c < nCubes; c++ )
        pCubes[c] = pSop + c * (nVars + 3);
    if ( nCubes < 300 )
        Bbl_ManSortCubes( pCubes, nCubes, nVars );
    pSopNew = BBLIF_ALLOC( char, Length + 1 );
    for ( c = 0; c < nCubes; c++ )
        memcpy( pSopNew + c * (nVars + 3), pCubes[c], nVars + 3 );
    BBLIF_FREE( pCubes );
    pSopNew[nCubes * (nVars + 3)] = 0;
    return pSopNew;
}